

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O0

void __thiscall UnifiedRegex::RegexPattern::Finalize(RegexPattern *this,bool isShutdown)

{
  code *pcVar1;
  bool bVar2;
  RegexFlags flags;
  uint uVar3;
  charcount_t cVar4;
  ThreadContext *this_00;
  JavascriptLibrary *this_01;
  ScriptContext *this_02;
  RegexPatternMruMap *this_03;
  char16 *source_00;
  undefined4 *puVar5;
  Program *this_04;
  ArenaAllocator *rtAllocator;
  undefined1 local_50 [6];
  bool isUniquePattern;
  bool isSourceLengthZero;
  byte local_39;
  RegexPattern *pRStack_38;
  bool hasRegexPatternForSourceKey;
  RegexPattern *p;
  InternalString source;
  ScriptContext *scriptContext;
  bool isShutdown_local;
  RegexPattern *this_local;
  
  if ((!isShutdown) &&
     (source.m_content.ptr = (char16_t *)GetScriptContext(this),
     (ScriptContext *)source.m_content.ptr != (ScriptContext *)0x0)) {
    if (((this->field_0x18 & 1) == 0) &&
       (uVar3 = (*(((ScriptContext *)source.m_content.ptr)->super_ScriptContextInfo).
                  _vptr_ScriptContextInfo[0x24])(), (uVar3 & 1) == 0)) {
      this_00 = Js::ScriptContext::GetThreadContext((ScriptContext *)source.m_content.ptr);
      bVar2 = ThreadContext::IsJSRT(this_00);
      if (!bVar2) {
        this_01 = Js::ScriptContext::GetLibrary((ScriptContext *)source.m_content.ptr);
        bVar2 = Js::JavascriptLibraryBase::IsChakraEngine(&this_01->super_JavascriptLibraryBase);
        if (!bVar2) {
          GetSource((RegexPattern *)&p);
          pRStack_38 = (RegexPattern *)0x0;
          this_02 = GetScriptContext(this);
          this_03 = Js::ScriptContext::GetDynamicRegexMap(this_02);
          source_00 = Js::InternalString::GetBuffer((InternalString *)&p);
          cVar4 = Js::InternalString::GetLength((InternalString *)&p);
          flags = GetFlags(this);
          RegexKey::RegexKey((RegexKey *)local_50,source_00,cVar4,flags);
          local_39 = JsUtil::
                     MruDictionary<UnifiedRegex::RegexKey,_UnifiedRegex::RegexPattern_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
                     ::TryGetValue(this_03,(RegexKey *)local_50,&stack0xffffffffffffffc8);
          cVar4 = Js::InternalString::GetLength((InternalString *)&p);
          if ((((local_39 & 1) != 0) && (cVar4 != 0)) && (pRStack_38 == this)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexPattern.cpp"
                               ,0x37,
                               "(!hasRegexPatternForSourceKey || isSourceLengthZero || isUniquePattern)"
                               ,
                               "!hasRegexPatternForSourceKey || isSourceLengthZero || isUniquePattern"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
      }
    }
    if (((byte)this->field_0x18 >> 1 & 1) == 0) {
      this_04 = Memory::WriteBarrierPtr<UnifiedRegex::Program>::operator->
                          (&(this->rep).unified.program);
      rtAllocator = Js::ScriptContext::RegexAllocator((ScriptContext *)source.m_content.ptr);
      Program::FreeBody(this_04,rtAllocator);
    }
  }
  return;
}

Assistant:

void RegexPattern::Finalize(bool isShutdown)
    {
        if (isShutdown)
        {
            return;
        }

        const auto scriptContext = GetScriptContext();
        if (!scriptContext)
        {
            return;
        }

#if DBG
        // In JSRT or ChakraEngine, we might not have a chance to close at finalize time
        if (!isLiteral && !scriptContext->IsClosed() &&
            !scriptContext->GetThreadContext()->IsJSRT() &&
            !scriptContext->GetLibrary()->IsChakraEngine())
        {
            const auto source = GetSource();
            RegexPattern *p = nullptr;

            bool hasRegexPatternForSourceKey = GetScriptContext()->GetDynamicRegexMap()->TryGetValue(
                RegexKey(source.GetBuffer(), source.GetLength(), GetFlags()), &p);
            bool isSourceLengthZero = source.GetLength() == 0;
            bool isUniquePattern = p != this;

            Assert(!hasRegexPatternForSourceKey || isSourceLengthZero || isUniquePattern);
        }
#endif

        if (isShallowClone)
        {
            return;
        }

        rep.unified.program->FreeBody(scriptContext->RegexAllocator());
    }